

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

int decode_nvrm_ioctl(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                     uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc,char *name
                     )

{
  undefined8 uVar1;
  code *pcVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  undefined7 in_register_00000011;
  int *piVar6;
  undefined6 in_register_00000082;
  
  piVar6 = (int *)CONCAT71(in_register_00000011,dir);
  uVar5 = (ulong)(uint)nvrm_ioctls_cnt;
  if (nvrm_ioctls_cnt < 1) {
    uVar5 = 0;
  }
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if (uVar5 * 0x30 + 0x30 == uVar4 + 0x30) {
      return 1;
    }
    uVar3 = uVar4 + 0x30;
  } while (*(uint32_t *)((long)&nvrm_ioctls[0].id + uVar4) != id);
  if (*(int *)((long)&nvrm_ioctls[0].size + uVar4) != *piVar6) {
    return 1;
  }
  if (dump_decoded_ioctl_data != 0) {
    if (*(int *)((long)&nvrm_ioctls[0].disabled + uVar4) == 0) {
      uVar1 = *(undefined8 *)((long)&nvrm_ioctls[0].name + uVar4);
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %-26s %-5s fd: %d, ",uVar1,err,(ulong)fd);
      }
      else {
        fprintf(_stdout,"%64s%-26s %-5s fd: %d, "," ",uVar1,err,(ulong)fd);
      }
      if (CONCAT71(in_register_00000009,nr) != 0) {
        fprintf(_stdout,"ret: %ld, ",CONCAT71(in_register_00000009,nr));
      }
      if (CONCAT62(in_register_00000082,size) != 0) {
        fprintf(_stdout,"%serr: %ld%s, ",colors->err,CONCAT62(in_register_00000082,size),
                colors->reset);
      }
      nvrm_pfx = "";
      pcVar2 = *(code **)((long)&nvrm_ioctls[0].fun + uVar4);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(piVar6 + 1);
      }
      pcVar2 = *(code **)((long)&nvrm_ioctls[0].fun_with_args + uVar4);
      if (pcVar2 == (code *)0x0) {
        if (dump_decoded_ioctl_data != 0) goto LAB_0025a014;
      }
      else {
        (*pcVar2)(piVar6 + 1,buf,ret & 0xffffffff);
      }
    }
    else {
LAB_0025a014:
      if (*(int *)((long)&nvrm_ioctls[0].disabled + uVar4) == 0) goto LAB_0025a106;
    }
  }
  if (dump_raw_ioctl_data == 0) {
    return 0;
  }
LAB_0025a106:
  dump_args((mmt_memory_dump *)buf,(int)ret,0);
  return 0;
}

Assistant:

static int decode_nvrm_ioctl(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr,
		uint16_t size, struct mmt_buf *buf, uint64_t ret, uint64_t err,
		void *state, struct mmt_memory_dump *args, int argc, const char *name)
{
	int k, found = 0;
	int args_used = 0;
	void (*fun)(void *) = NULL;
	void (*fun_with_args)(void *, struct mmt_memory_dump *, int argc) = NULL;

	struct nvrm_ioctl *ioctl;
	for (k = 0; k < nvrm_ioctls_cnt; ++k)
	{
		ioctl = &nvrm_ioctls[k];
		if (ioctl->id == id)
		{
			if (ioctl->size == buf->len)
			{
				if (dump_decoded_ioctl_data && !ioctl->disabled)
				{
					mmt_log("%-26s %-5s fd: %d, ", ioctl->name, name, fd);
					if (ret)
						mmt_log_cont("ret: %" PRId64 ", ", ret);
					if (err)
						mmt_log_cont("%serr: %" PRId64 "%s, ", colors->err, err, colors->reset);

					nvrm_reset_pfx();
					fun = ioctl->fun;
					if (fun)
						fun(buf->data);
					fun_with_args = ioctl->fun_with_args;
					if (fun_with_args)
					{
						fun_with_args(buf->data, args, argc);
						args_used = 1;
					}
				}
				found = 1;
			}
			break;
		}
	}

	if (!found)
		return 1;

	if ((!args_used && dump_decoded_ioctl_data && !ioctl->disabled) || dump_raw_ioctl_data)
		dump_args(args, argc, 0);

	return 0;
}